

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-socket.c
# Opt level: O2

int lreadline(lua_State *L)

{
  int skip;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  socket_buffer *psVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  int iVar12;
  ulong uVar13;
  char *__s2;
  buffer_node *pbVar14;
  buffer_node *pbVar15;
  size_t seplen;
  socket_buffer *local_40;
  char *local_38;
  
  psVar5 = (socket_buffer *)lua_touserdata(L,1);
  if (psVar5 == (socket_buffer *)0x0) {
    iVar1 = luaL_error(L,"Need buffer object at param 1");
    return iVar1;
  }
  iVar1 = lua_type(L,2);
  seplen = 0;
  local_38 = luaL_checklstring(L,3,&seplen);
  pbVar14 = psVar5->head;
  if (pbVar14 != (buffer_node *)0x0) {
    iVar8 = psVar5->offset;
    iVar9 = pbVar14->sz - iVar8;
    skip = (int)seplen;
    uVar6 = seplen & 0xffffffff;
    iVar7 = psVar5->size - (int)seplen;
    local_40 = psVar5;
    for (iVar4 = 0; uVar13 = uVar6, __s2 = local_38, pbVar15 = pbVar14, iVar3 = iVar8,
        iVar4 <= iVar7; iVar4 = iVar4 + 1) {
      while( true ) {
        lVar11 = (long)iVar3;
        uVar10 = pbVar15->sz - lVar11;
        iVar3 = (int)uVar10;
        iVar12 = (int)uVar13;
        if (iVar12 - iVar3 == 0 || iVar12 < iVar3) break;
        if ((0 < iVar3) &&
           (iVar2 = bcmp(pbVar15->msg + lVar11,__s2,uVar10 & 0xffffffff), iVar2 != 0))
        goto LAB_0011d765;
        uVar13 = (ulong)(uint)(iVar12 - iVar3);
        __s2 = __s2 + uVar10;
        pbVar15 = pbVar15->next;
        iVar3 = 0;
      }
      iVar3 = bcmp(pbVar15->msg + lVar11,__s2,(long)iVar12);
      psVar5 = local_40;
      if (iVar3 == 0) {
        if (iVar1 != 5) {
          lua_pushboolean(L,1);
          return 1;
        }
        pop_lstring(L,local_40,iVar4 + skip,skip);
        psVar5->size = psVar5->size - (iVar4 + (int)seplen);
        return 1;
      }
LAB_0011d765:
      iVar9 = iVar9 + -1;
      if (iVar9 == 0) {
        pbVar14 = pbVar14->next;
        if (pbVar14 == (buffer_node *)0x0) {
          return 0;
        }
        iVar9 = pbVar14->sz;
        iVar8 = 0;
      }
      else {
        iVar8 = iVar8 + 1;
      }
    }
  }
  return 0;
}

Assistant:

static int
lreadline(lua_State *L) {
	struct socket_buffer * sb = lua_touserdata(L, 1);
	if (sb == NULL) {
		return luaL_error(L, "Need buffer object at param 1");
	}
	// only check
	bool check = !lua_istable(L, 2);
	size_t seplen = 0;
	const char *sep = luaL_checklstring(L,3,&seplen);
	int i;
	struct buffer_node *current = sb->head;
	if (current == NULL)
		return 0;
	int from = sb->offset;
	int bytes = current->sz - from;
	for (i=0;i<=sb->size - (int)seplen;i++) {
		if (check_sep(current, from, sep, seplen)) {
			if (check) {
				lua_pushboolean(L,true);
			} else {
				pop_lstring(L, sb, i+seplen, seplen);
				sb->size -= i+seplen;
			}
			return 1;
		}
		++from;
		--bytes;
		if (bytes == 0) {
			current = current->next;
			from = 0;
			if (current == NULL)
				break;
			bytes = current->sz;
		}
	}
	return 0;
}